

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.h
# Opt level: O0

double __thiscall el::Logger::log(Logger *this,double __x)

{
  char *pcVar1;
  ostream *in_RSI;
  double extraout_XMM0_Qa;
  ostream_t *os_local;
  Logger *this_local;
  
  pcVar1 = (char *)std::__cxx11::string::c_str();
  std::operator<<(in_RSI,pcVar1);
  return extraout_XMM0_Qa;
}

Assistant:

virtual inline void log(el::base::type::ostream_t& os) const {
    os << m_id.c_str();
  }